

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_time.c
# Opt level: O2

void line_float(t_line_conflict *x,t_float f)

{
  float fVar1;
  double dVar2;
  double dVar3;
  t_float tVar4;
  
  dVar2 = clock_getsystime();
  if ((x->x_gotinlet == 0) || (x->x_in1val <= 0.0)) {
    clock_unset(x->x_clock);
    x->x_setval = f;
    x->x_targetval = f;
    outlet_float((x->x_obj).te_outlet,f);
  }
  else {
    if (dVar2 < x->x_targettime || dVar2 == x->x_targettime) {
      tVar4 = (t_float)((double)(x->x_targetval - x->x_setval) *
                        (dVar2 - x->x_prevtime) * x->x_1overtimediff + (double)x->x_setval);
    }
    else {
      tVar4 = x->x_targetval;
    }
    x->x_setval = tVar4;
    x->x_prevtime = dVar2;
    dVar3 = clock_getsystimeafter(x->x_in1val);
    x->x_targettime = dVar3;
    x->x_targetval = f;
    line_tick(x);
    x->x_gotinlet = 0;
    x->x_1overtimediff = 1.0 / (x->x_targettime - dVar2);
    fVar1 = x->x_grain;
    if (fVar1 <= 0.0) {
      x->x_grain = 20.0;
      fVar1 = 20.0;
    }
    dVar2 = x->x_in1val;
    if ((double)fVar1 <= x->x_in1val) {
      dVar2 = (double)fVar1;
    }
    clock_delay(x->x_clock,dVar2);
  }
  x->x_gotinlet = 0;
  return;
}

Assistant:

static void line_float(t_line *x, t_float f)
{
    double timenow = clock_getsystime();
    if (x->x_gotinlet && x->x_in1val > 0)
    {
        if (timenow > x->x_targettime) x->x_setval = x->x_targetval;
        else x->x_setval = x->x_setval + x->x_1overtimediff *
            (timenow - x->x_prevtime)
            * (x->x_targetval - x->x_setval);
        x->x_prevtime = timenow;
        x->x_targettime = clock_getsystimeafter(x->x_in1val);
        x->x_targetval = f;
        line_tick(x);
        x->x_gotinlet = 0;
        x->x_1overtimediff = 1./ (x->x_targettime - timenow);
        if (x->x_grain <= 0)
            x->x_grain = DEFAULTLINEGRAIN;
        clock_delay(x->x_clock,
            (x->x_grain > x->x_in1val ? x->x_in1val : x->x_grain));

    }
    else
    {
        clock_unset(x->x_clock);
        x->x_targetval = x->x_setval = f;
        outlet_float(x->x_obj.ob_outlet, f);
    }
    x->x_gotinlet = 0;
}